

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakF-1600-opt64.c
# Opt level: O0

void KeccakPermutationOnWordsAfterXoring1344bits(UINT64 *state,UINT64 *input)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong *in_RSI;
  ulong *in_RDI;
  UINT64 Ego;
  UINT64 Egi;
  UINT64 Ege;
  UINT64 Ega;
  UINT64 Ebu;
  UINT64 Ebo;
  UINT64 Ebi;
  UINT64 Ebe;
  UINT64 Eba;
  UINT64 Du;
  UINT64 Do;
  UINT64 Di;
  UINT64 De;
  UINT64 Da;
  UINT64 Cu;
  UINT64 Co;
  UINT64 Ci;
  UINT64 Ce;
  UINT64 Ca;
  UINT64 Bsu;
  UINT64 Bso;
  UINT64 Bsi;
  UINT64 Bse;
  UINT64 Bsa;
  UINT64 Bmu;
  UINT64 Bmo;
  UINT64 Bmi;
  UINT64 Bme;
  UINT64 Bma;
  UINT64 Bku;
  UINT64 Bko;
  UINT64 Bki;
  UINT64 Bke;
  UINT64 Bka;
  UINT64 Bgu;
  UINT64 Bgo;
  UINT64 Bgi;
  UINT64 Bge;
  UINT64 Bga;
  UINT64 Bbu;
  UINT64 Bbo;
  UINT64 Bbi;
  UINT64 Bbe;
  UINT64 Bba;
  UINT64 Asu;
  UINT64 Aso;
  UINT64 Asi;
  UINT64 Ase;
  UINT64 Asa;
  UINT64 Amu;
  UINT64 Amo;
  UINT64 Ami;
  UINT64 Ame;
  UINT64 Ama;
  UINT64 Aku;
  UINT64 Ako;
  UINT64 Aki;
  UINT64 Ake;
  UINT64 Aka;
  UINT64 Agu;
  UINT64 Ago;
  UINT64 Agi;
  UINT64 Age;
  UINT64 Aga;
  UINT64 Abu;
  UINT64 Abo;
  UINT64 Abi;
  UINT64 Abe;
  UINT64 Aba;
  UINT64 Esu;
  UINT64 Eso;
  UINT64 Esi;
  UINT64 Ese;
  UINT64 Esa;
  UINT64 Emu;
  UINT64 Emo;
  UINT64 Emi;
  UINT64 Eme;
  UINT64 Ema;
  UINT64 Eku;
  UINT64 Eko;
  UINT64 Eki;
  UINT64 Eke;
  UINT64 Eka;
  UINT64 Egu;
  
  uVar1 = *in_RDI ^ *in_RSI ^ in_RDI[5] ^ in_RSI[5] ^ in_RDI[10] ^ in_RSI[10] ^
          in_RDI[0xf] ^ in_RSI[0xf] ^ in_RDI[0x14] ^ in_RSI[0x14];
  uVar2 = in_RDI[1] ^ in_RSI[1] ^ in_RDI[6] ^ in_RSI[6] ^ in_RDI[0xb] ^ in_RSI[0xb] ^
          in_RDI[0x10] ^ in_RSI[0x10] ^ in_RDI[0x15];
  uVar3 = in_RDI[2] ^ in_RSI[2] ^ in_RDI[7] ^ in_RSI[7] ^ in_RDI[0xc] ^ in_RSI[0xc] ^
          in_RDI[0x11] ^ in_RSI[0x11] ^ in_RDI[0x16];
  uVar4 = in_RDI[3] ^ in_RSI[3] ^ in_RDI[8] ^ in_RSI[8] ^ in_RDI[0xd] ^ in_RSI[0xd] ^
          in_RDI[0x12] ^ in_RSI[0x12] ^ in_RDI[0x17];
  uVar5 = in_RDI[4] ^ in_RSI[4] ^ in_RDI[9] ^ in_RSI[9] ^ in_RDI[0xe] ^ in_RSI[0xe] ^
          in_RDI[0x13] ^ in_RSI[0x13] ^ in_RDI[0x18];
  uVar6 = uVar5 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
  uVar7 = uVar1 ^ uVar3 << 1 ^ uVar3 >> 0x3f;
  uVar2 = uVar2 ^ uVar4 << 1 ^ uVar4 >> 0x3f;
  uVar3 = uVar3 ^ uVar5 << 1 ^ uVar5 >> 0x3f;
  uVar4 = uVar4 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar1 = uVar6 ^ *in_RDI ^ *in_RSI;
  uVar5 = uVar7 ^ in_RDI[6] ^ in_RSI[6];
  uVar5 = uVar5 << 0x2c ^ uVar5 >> 0x14;
  uVar8 = uVar2 ^ in_RDI[0xc] ^ in_RSI[0xc];
  uVar9 = uVar8 << 0x2b ^ uVar8 >> 0x15;
  uVar8 = uVar3 ^ in_RDI[0x12] ^ in_RSI[0x12];
  uVar10 = uVar8 << 0x15 ^ uVar8 >> 0x2b;
  uVar8 = uVar4 ^ in_RDI[0x18];
  uVar11 = uVar8 << 0xe ^ uVar8 >> 0x32;
  uVar12 = uVar1 ^ (uVar5 | uVar9) ^ 1;
  uVar13 = uVar5 ^ (uVar9 ^ 0xffffffffffffffff | uVar10);
  uVar9 = uVar9 ^ uVar10 & uVar11;
  uVar10 = uVar10 ^ (uVar11 | uVar1);
  uVar11 = uVar11 ^ uVar1 & uVar5;
  uVar1 = uVar3 ^ in_RDI[3] ^ in_RSI[3];
  uVar1 = uVar1 << 0x1c ^ uVar1 >> 0x24;
  uVar5 = uVar4 ^ in_RDI[9] ^ in_RSI[9];
  uVar5 = uVar5 << 0x14 ^ uVar5 >> 0x2c;
  uVar8 = uVar6 ^ in_RDI[10] ^ in_RSI[10];
  uVar14 = uVar8 << 3 ^ uVar8 >> 0x3d;
  uVar8 = uVar7 ^ in_RDI[0x10] ^ in_RSI[0x10];
  uVar15 = uVar8 << 0x2d ^ uVar8 >> 0x13;
  uVar8 = uVar2 ^ in_RDI[0x16];
  uVar16 = uVar8 << 0x3d ^ uVar8 >> 3;
  uVar17 = uVar1 ^ (uVar5 | uVar14);
  uVar18 = uVar5 ^ uVar14 & uVar15;
  uVar14 = uVar14 ^ (uVar15 | uVar16 ^ 0xffffffffffffffff);
  uVar15 = uVar15 ^ (uVar16 | uVar1);
  uVar16 = uVar16 ^ uVar1 & uVar5;
  uVar1 = uVar7 ^ in_RDI[1] ^ in_RSI[1];
  uVar1 = uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar5 = uVar2 ^ in_RDI[7] ^ in_RSI[7];
  uVar5 = uVar5 << 6 ^ uVar5 >> 0x3a;
  uVar8 = uVar3 ^ in_RDI[0xd] ^ in_RSI[0xd];
  uVar19 = uVar8 << 0x19 ^ uVar8 >> 0x27;
  uVar8 = uVar4 ^ in_RDI[0x13] ^ in_RSI[0x13];
  uVar8 = uVar8 << 8 ^ uVar8 >> 0x38;
  uVar20 = uVar6 ^ in_RDI[0x14] ^ in_RSI[0x14];
  uVar20 = uVar20 << 0x12 ^ uVar20 >> 0x2e;
  uVar21 = uVar1 ^ (uVar5 | uVar19);
  uVar22 = uVar5 ^ uVar19 & uVar8;
  uVar19 = uVar19 ^ (uVar8 ^ 0xffffffffffffffff) & uVar20;
  uVar23 = uVar8 ^ 0xffffffffffffffff ^ (uVar20 | uVar1);
  uVar20 = uVar20 ^ uVar1 & uVar5;
  uVar1 = uVar4 ^ in_RDI[4] ^ in_RSI[4];
  uVar1 = uVar1 << 0x1b ^ uVar1 >> 0x25;
  uVar5 = uVar6 ^ in_RDI[5] ^ in_RSI[5];
  uVar5 = uVar5 << 0x24 ^ uVar5 >> 0x1c;
  uVar8 = uVar7 ^ in_RDI[0xb] ^ in_RSI[0xb];
  uVar24 = uVar8 << 10 ^ uVar8 >> 0x36;
  uVar8 = uVar2 ^ in_RDI[0x11] ^ in_RSI[0x11];
  uVar8 = uVar8 << 0xf ^ uVar8 >> 0x31;
  uVar25 = uVar3 ^ in_RDI[0x17];
  uVar26 = uVar25 << 0x38 ^ uVar25 >> 8;
  uVar25 = uVar1 ^ uVar5 & uVar24;
  uVar27 = uVar5 ^ (uVar24 | uVar8);
  uVar24 = uVar24 ^ (uVar8 ^ 0xffffffffffffffff | uVar26);
  uVar28 = uVar8 ^ 0xffffffffffffffff ^ uVar26 & uVar1;
  uVar26 = uVar26 ^ (uVar1 | uVar5);
  uVar2 = uVar2 ^ in_RDI[2] ^ in_RSI[2];
  uVar1 = uVar2 << 0x3e ^ uVar2 >> 2;
  uVar3 = uVar3 ^ in_RDI[8] ^ in_RSI[8];
  uVar5 = uVar3 << 0x37 ^ uVar3 >> 9;
  uVar4 = uVar4 ^ in_RDI[0xe] ^ in_RSI[0xe];
  uVar4 = uVar4 << 0x27 ^ uVar4 >> 0x19;
  uVar6 = uVar6 ^ in_RDI[0xf] ^ in_RSI[0xf];
  uVar29 = uVar6 << 0x29 ^ uVar6 >> 0x17;
  uVar7 = uVar7 ^ in_RDI[0x15];
  uVar3 = uVar7 << 2 ^ uVar7 >> 0x3e;
  uVar6 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar4;
  uVar8 = uVar6 ^ uVar25 ^ uVar21 ^ uVar17 ^ uVar12;
  uVar2 = uVar5 ^ 0xffffffffffffffff ^ (uVar4 | uVar29);
  uVar30 = uVar2 ^ uVar27 ^ uVar22 ^ uVar18 ^ uVar13;
  uVar4 = uVar4 ^ uVar29 & uVar3;
  uVar31 = uVar4 ^ uVar24 ^ uVar19 ^ uVar14 ^ uVar9;
  uVar29 = uVar29 ^ (uVar3 | uVar1);
  uVar32 = uVar29 ^ uVar28 ^ uVar23 ^ uVar15 ^ uVar10;
  uVar3 = uVar3 ^ uVar1 & uVar5;
  uVar1 = uVar3 ^ uVar26 ^ uVar20 ^ uVar16 ^ uVar11;
  uVar33 = uVar1 ^ uVar30 << 1 ^ uVar30 >> 0x3f;
  uVar34 = uVar8 ^ uVar31 << 1 ^ uVar31 >> 0x3f;
  uVar30 = uVar30 ^ uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar31 = uVar31 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar32 = uVar32 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
  uVar12 = uVar33 ^ uVar12;
  uVar18 = uVar34 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar30 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar28 = uVar31 ^ uVar28;
  uVar28 = uVar28 << 0x15 ^ uVar28 >> 0x2b;
  uVar3 = uVar32 ^ uVar3;
  uVar35 = uVar3 << 0xe ^ uVar3 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8082;
  uVar36 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar28);
  uVar5 = uVar5 ^ uVar28 & uVar35;
  uVar28 = uVar28 ^ (uVar35 | uVar12);
  uVar35 = uVar35 ^ uVar12 & uVar1;
  uVar10 = uVar31 ^ uVar10;
  uVar1 = uVar10 << 0x1c ^ uVar10 >> 0x24;
  uVar16 = uVar32 ^ uVar16;
  uVar8 = uVar16 << 0x14 ^ uVar16 >> 0x2c;
  uVar21 = uVar33 ^ uVar21;
  uVar37 = uVar21 << 3 ^ uVar21 >> 0x3d;
  uVar27 = uVar34 ^ uVar27;
  uVar3 = uVar27 << 0x2d ^ uVar27 >> 0x13;
  uVar4 = uVar30 ^ uVar4;
  uVar10 = uVar4 << 0x3d ^ uVar4 >> 3;
  uVar38 = uVar1 ^ (uVar8 | uVar37);
  uVar12 = uVar8 ^ uVar37 & uVar3;
  uVar37 = uVar37 ^ (uVar3 | uVar10 ^ 0xffffffffffffffff);
  uVar3 = uVar3 ^ (uVar10 | uVar1);
  uVar10 = uVar10 ^ uVar1 & uVar8;
  uVar13 = uVar34 ^ uVar13;
  uVar1 = uVar13 << 1 ^ uVar13 >> 0x3f;
  uVar14 = uVar30 ^ uVar14;
  uVar8 = uVar14 << 6 ^ uVar14 >> 0x3a;
  uVar23 = uVar31 ^ uVar23;
  uVar19 = uVar23 << 0x19 ^ uVar23 >> 0x27;
  uVar26 = uVar32 ^ uVar26;
  uVar4 = uVar26 << 8 ^ uVar26 >> 0x38;
  uVar6 = uVar33 ^ uVar6;
  uVar6 = uVar6 << 0x12 ^ uVar6 >> 0x2e;
  uVar16 = uVar1 ^ (uVar8 | uVar19);
  uVar23 = uVar8 ^ uVar19 & uVar4;
  uVar19 = uVar19 ^ (uVar4 ^ 0xffffffffffffffff) & uVar6;
  uVar13 = uVar4 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar8;
  uVar11 = uVar32 ^ uVar11;
  uVar1 = uVar11 << 0x1b ^ uVar11 >> 0x25;
  uVar17 = uVar33 ^ uVar17;
  uVar8 = uVar17 << 0x24 ^ uVar17 >> 0x1c;
  uVar22 = uVar34 ^ uVar22;
  uVar26 = uVar22 << 10 ^ uVar22 >> 0x36;
  uVar24 = uVar30 ^ uVar24;
  uVar4 = uVar24 << 0xf ^ uVar24 >> 0x31;
  uVar29 = uVar31 ^ uVar29;
  uVar14 = uVar29 << 0x38 ^ uVar29 >> 8;
  uVar7 = uVar1 ^ uVar8 & uVar26;
  uVar21 = uVar8 ^ (uVar26 | uVar4);
  uVar26 = uVar26 ^ (uVar4 ^ 0xffffffffffffffff | uVar14);
  uVar4 = uVar4 ^ 0xffffffffffffffff ^ uVar14 & uVar1;
  uVar14 = uVar14 ^ (uVar1 | uVar8);
  uVar30 = uVar30 ^ uVar9;
  uVar1 = uVar30 << 0x3e ^ uVar30 >> 2;
  uVar31 = uVar31 ^ uVar15;
  uVar8 = uVar31 << 0x37 ^ uVar31 >> 9;
  uVar32 = uVar32 ^ uVar20;
  uVar27 = uVar32 << 0x27 ^ uVar32 >> 0x19;
  uVar33 = uVar33 ^ uVar25;
  uVar11 = uVar33 << 0x29 ^ uVar33 >> 0x17;
  uVar34 = uVar34 ^ uVar2;
  uVar20 = uVar34 << 2 ^ uVar34 >> 0x3e;
  uVar2 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar27;
  uVar9 = uVar2 ^ uVar7 ^ uVar16 ^ uVar38 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar27 | uVar11);
  uVar17 = uVar15 ^ uVar21 ^ uVar23 ^ uVar12 ^ uVar36;
  uVar27 = uVar27 ^ uVar11 & uVar20;
  uVar22 = uVar27 ^ uVar26 ^ uVar19 ^ uVar37 ^ uVar5;
  uVar11 = uVar11 ^ (uVar20 | uVar1);
  uVar24 = uVar11 ^ uVar4 ^ uVar13 ^ uVar3 ^ uVar28;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar14 ^ uVar6 ^ uVar10 ^ uVar35;
  uVar29 = uVar1 ^ uVar17 << 1 ^ uVar17 >> 0x3f;
  uVar30 = uVar9 ^ uVar22 << 1 ^ uVar22 >> 0x3f;
  uVar17 = uVar17 ^ uVar24 << 1 ^ uVar24 >> 0x3f;
  uVar22 = uVar22 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar24 = uVar24 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar29 ^ uVar18;
  uVar12 = uVar30 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar17 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar4 = uVar22 ^ uVar4;
  uVar31 = uVar4 << 0x15 ^ uVar4 >> 0x2b;
  uVar20 = uVar24 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x800000000000808a;
  uVar32 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar31);
  uVar8 = uVar8 ^ uVar31 & uVar34;
  uVar31 = uVar31 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar28 = uVar22 ^ uVar28;
  uVar1 = uVar28 << 0x1c ^ uVar28 >> 0x24;
  uVar10 = uVar24 ^ uVar10;
  uVar9 = uVar10 << 0x14 ^ uVar10 >> 0x2c;
  uVar16 = uVar29 ^ uVar16;
  uVar33 = uVar16 << 3 ^ uVar16 >> 0x3d;
  uVar21 = uVar30 ^ uVar21;
  uVar20 = uVar21 << 0x2d ^ uVar21 >> 0x13;
  uVar27 = uVar17 ^ uVar27;
  uVar28 = uVar27 << 0x3d ^ uVar27 >> 3;
  uVar39 = uVar1 ^ (uVar9 | uVar33);
  uVar18 = uVar9 ^ uVar33 & uVar20;
  uVar33 = uVar33 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar36 = uVar30 ^ uVar36;
  uVar1 = uVar36 << 1 ^ uVar36 >> 0x3f;
  uVar37 = uVar17 ^ uVar37;
  uVar9 = uVar37 << 6 ^ uVar37 >> 0x3a;
  uVar13 = uVar22 ^ uVar13;
  uVar19 = uVar13 << 0x19 ^ uVar13 >> 0x27;
  uVar14 = uVar24 ^ uVar14;
  uVar25 = uVar14 << 8 ^ uVar14 >> 0x38;
  uVar2 = uVar29 ^ uVar2;
  uVar2 = uVar2 << 0x12 ^ uVar2 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar13 = uVar9 ^ uVar19 & uVar25;
  uVar19 = uVar19 ^ (uVar25 ^ 0xffffffffffffffff) & uVar2;
  uVar21 = uVar25 ^ 0xffffffffffffffff ^ (uVar2 | uVar1);
  uVar2 = uVar2 ^ uVar1 & uVar9;
  uVar35 = uVar24 ^ uVar35;
  uVar1 = uVar35 << 0x1b ^ uVar35 >> 0x25;
  uVar38 = uVar29 ^ uVar38;
  uVar9 = uVar38 << 0x24 ^ uVar38 >> 0x1c;
  uVar23 = uVar30 ^ uVar23;
  uVar14 = uVar23 << 10 ^ uVar23 >> 0x36;
  uVar26 = uVar17 ^ uVar26;
  uVar25 = uVar26 << 0xf ^ uVar26 >> 0x31;
  uVar11 = uVar22 ^ uVar11;
  uVar27 = uVar11 << 0x38 ^ uVar11 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar14;
  uVar16 = uVar9 ^ (uVar14 | uVar25);
  uVar14 = uVar14 ^ (uVar25 ^ 0xffffffffffffffff | uVar27);
  uVar25 = uVar25 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar17 = uVar17 ^ uVar5;
  uVar1 = uVar17 << 0x3e ^ uVar17 >> 2;
  uVar22 = uVar22 ^ uVar3;
  uVar5 = uVar22 << 0x37 ^ uVar22 >> 9;
  uVar24 = uVar24 ^ uVar6;
  uVar6 = uVar24 << 0x27 ^ uVar24 >> 0x19;
  uVar29 = uVar29 ^ uVar7;
  uVar23 = uVar29 << 0x29 ^ uVar29 >> 0x17;
  uVar30 = uVar30 ^ uVar15;
  uVar3 = uVar30 << 2 ^ uVar30 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar39 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar23);
  uVar26 = uVar15 ^ uVar16 ^ uVar13 ^ uVar18 ^ uVar32;
  uVar6 = uVar6 ^ uVar23 & uVar3;
  uVar11 = uVar6 ^ uVar14 ^ uVar19 ^ uVar33 ^ uVar8;
  uVar23 = uVar23 ^ (uVar3 | uVar1);
  uVar17 = uVar23 ^ uVar25 ^ uVar21 ^ uVar20 ^ uVar31;
  uVar3 = uVar3 ^ uVar1 & uVar5;
  uVar1 = uVar3 ^ uVar27 ^ uVar2 ^ uVar28 ^ uVar34;
  uVar22 = uVar1 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar24 = uVar9 ^ uVar11 << 1 ^ uVar11 >> 0x3f;
  uVar26 = uVar26 ^ uVar17 << 1 ^ uVar17 >> 0x3f;
  uVar11 = uVar11 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar17 = uVar17 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar22 ^ uVar12;
  uVar18 = uVar24 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar26 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar25 = uVar11 ^ uVar25;
  uVar29 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
  uVar3 = uVar17 ^ uVar3;
  uVar36 = uVar3 << 0xe ^ uVar3 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000080008000;
  uVar30 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar29);
  uVar5 = uVar5 ^ uVar29 & uVar36;
  uVar29 = uVar29 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar31 = uVar11 ^ uVar31;
  uVar1 = uVar31 << 0x1c ^ uVar31 >> 0x24;
  uVar28 = uVar17 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar22 ^ uVar10;
  uVar31 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar24 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar26 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar31);
  uVar12 = uVar9 ^ uVar31 & uVar25;
  uVar31 = uVar31 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar24 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar33 = uVar26 ^ uVar33;
  uVar9 = uVar33 << 6 ^ uVar33 >> 0x3a;
  uVar21 = uVar11 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar17 ^ uVar27;
  uVar3 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar22 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar32 = uVar9 ^ uVar19 & uVar3;
  uVar19 = uVar19 ^ (uVar3 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar3 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar17 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar39 = uVar22 ^ uVar39;
  uVar9 = uVar39 << 0x24 ^ uVar39 >> 0x1c;
  uVar13 = uVar24 ^ uVar13;
  uVar13 = uVar13 << 10 ^ uVar13 >> 0x36;
  uVar14 = uVar26 ^ uVar14;
  uVar3 = uVar14 << 0xf ^ uVar14 >> 0x31;
  uVar23 = uVar11 ^ uVar23;
  uVar27 = uVar23 << 0x38 ^ uVar23 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar13;
  uVar16 = uVar9 ^ (uVar13 | uVar3);
  uVar13 = uVar13 ^ (uVar3 ^ 0xffffffffffffffff | uVar27);
  uVar3 = uVar3 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar26 = uVar26 ^ uVar8;
  uVar1 = uVar26 << 0x3e ^ uVar26 >> 2;
  uVar11 = uVar11 ^ uVar20;
  uVar8 = uVar11 << 0x37 ^ uVar11 >> 9;
  uVar17 = uVar17 ^ uVar2;
  uVar2 = uVar17 << 0x27 ^ uVar17 >> 0x19;
  uVar22 = uVar22 ^ uVar4;
  uVar14 = uVar22 << 0x29 ^ uVar22 >> 0x17;
  uVar24 = uVar24 ^ uVar15;
  uVar20 = uVar24 << 2 ^ uVar24 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar2;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar2 | uVar14);
  uVar23 = uVar15 ^ uVar16 ^ uVar32 ^ uVar12 ^ uVar30;
  uVar2 = uVar2 ^ uVar14 & uVar20;
  uVar26 = uVar2 ^ uVar13 ^ uVar19 ^ uVar31 ^ uVar5;
  uVar14 = uVar14 ^ (uVar20 | uVar1);
  uVar11 = uVar14 ^ uVar3 ^ uVar21 ^ uVar25 ^ uVar29;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar17 = uVar1 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar22 = uVar9 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar11 << 1 ^ uVar11 >> 0x3f;
  uVar26 = uVar26 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar11 = uVar11 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar17 ^ uVar18;
  uVar12 = uVar22 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar23 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar3 = uVar26 ^ uVar3;
  uVar24 = uVar3 << 0x15 ^ uVar3 >> 0x2b;
  uVar20 = uVar11 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x808b;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar24);
  uVar8 = uVar8 ^ uVar24 & uVar34;
  uVar24 = uVar24 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar29 = uVar26 ^ uVar29;
  uVar1 = uVar29 << 0x1c ^ uVar29 >> 0x24;
  uVar28 = uVar11 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar17 ^ uVar10;
  uVar29 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar22 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar2 = uVar23 ^ uVar2;
  uVar28 = uVar2 << 0x3d ^ uVar2 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar29);
  uVar18 = uVar9 ^ uVar29 & uVar20;
  uVar29 = uVar29 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar30 = uVar22 ^ uVar30;
  uVar1 = uVar30 << 1 ^ uVar30 >> 0x3f;
  uVar31 = uVar23 ^ uVar31;
  uVar9 = uVar31 << 6 ^ uVar31 >> 0x3a;
  uVar21 = uVar26 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar11 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar17 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar30 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar11 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar17 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar32 = uVar22 ^ uVar32;
  uVar31 = uVar32 << 10 ^ uVar32 >> 0x36;
  uVar13 = uVar23 ^ uVar13;
  uVar2 = uVar13 << 0xf ^ uVar13 >> 0x31;
  uVar14 = uVar26 ^ uVar14;
  uVar27 = uVar14 << 0x38 ^ uVar14 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar31;
  uVar16 = uVar9 ^ (uVar31 | uVar2);
  uVar31 = uVar31 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar23 = uVar23 ^ uVar5;
  uVar1 = uVar23 << 0x3e ^ uVar23 >> 2;
  uVar26 = uVar26 ^ uVar25;
  uVar5 = uVar26 << 0x37 ^ uVar26 >> 9;
  uVar11 = uVar11 ^ uVar6;
  uVar6 = uVar11 << 0x27 ^ uVar11 >> 0x19;
  uVar17 = uVar17 ^ uVar7;
  uVar13 = uVar17 << 0x29 ^ uVar17 >> 0x17;
  uVar22 = uVar22 ^ uVar15;
  uVar25 = uVar22 << 2 ^ uVar22 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar30 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar31 ^ uVar19 ^ uVar29 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar24;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar22 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x80000001;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar22);
  uVar5 = uVar5 ^ uVar22 & uVar36;
  uVar22 = uVar22 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar24 = uVar23 ^ uVar24;
  uVar1 = uVar24 << 0x1c ^ uVar24 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar24 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar24);
  uVar12 = uVar9 ^ uVar24 & uVar25;
  uVar24 = uVar24 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar29 = uVar14 ^ uVar29;
  uVar9 = uVar29 << 6 ^ uVar29 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar29 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar30 = uVar17 ^ uVar30;
  uVar30 = uVar30 << 10 ^ uVar30 >> 0x36;
  uVar31 = uVar14 ^ uVar31;
  uVar2 = uVar31 << 0xf ^ uVar31 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar30;
  uVar16 = uVar9 ^ (uVar30 | uVar2);
  uVar30 = uVar30 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar29 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar30 ^ uVar19 ^ uVar24 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar22;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar31 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x8000000080008081;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar31);
  uVar8 = uVar8 ^ uVar31 & uVar34;
  uVar31 = uVar31 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar22 = uVar23 ^ uVar22;
  uVar1 = uVar22 << 0x1c ^ uVar22 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar22 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar22);
  uVar18 = uVar9 ^ uVar22 & uVar20;
  uVar22 = uVar22 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar24 = uVar14 ^ uVar24;
  uVar9 = uVar24 << 6 ^ uVar24 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar24 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar29 = uVar17 ^ uVar29;
  uVar29 = uVar29 << 10 ^ uVar29 >> 0x36;
  uVar30 = uVar14 ^ uVar30;
  uVar2 = uVar30 << 0xf ^ uVar30 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar29;
  uVar16 = uVar9 ^ (uVar29 | uVar2);
  uVar29 = uVar29 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar24 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar29 ^ uVar19 ^ uVar22 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar31;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar30 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000000008009;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar30);
  uVar5 = uVar5 ^ uVar30 & uVar36;
  uVar30 = uVar30 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar31 = uVar23 ^ uVar31;
  uVar1 = uVar31 << 0x1c ^ uVar31 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar31 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar31);
  uVar12 = uVar9 ^ uVar31 & uVar25;
  uVar31 = uVar31 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar22 = uVar14 ^ uVar22;
  uVar9 = uVar22 << 6 ^ uVar22 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar22 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar24 = uVar17 ^ uVar24;
  uVar24 = uVar24 << 10 ^ uVar24 >> 0x36;
  uVar29 = uVar14 ^ uVar29;
  uVar2 = uVar29 << 0xf ^ uVar29 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar24;
  uVar16 = uVar9 ^ (uVar24 | uVar2);
  uVar24 = uVar24 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar22 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar24 ^ uVar19 ^ uVar31 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar30;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar29 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x8a;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar29);
  uVar8 = uVar8 ^ uVar29 & uVar34;
  uVar29 = uVar29 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar30 = uVar23 ^ uVar30;
  uVar1 = uVar30 << 0x1c ^ uVar30 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar30 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar30);
  uVar18 = uVar9 ^ uVar30 & uVar20;
  uVar30 = uVar30 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar31 = uVar14 ^ uVar31;
  uVar9 = uVar31 << 6 ^ uVar31 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar31 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar22 = uVar17 ^ uVar22;
  uVar22 = uVar22 << 10 ^ uVar22 >> 0x36;
  uVar24 = uVar14 ^ uVar24;
  uVar2 = uVar24 << 0xf ^ uVar24 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar22;
  uVar16 = uVar9 ^ (uVar22 | uVar2);
  uVar22 = uVar22 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar31 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar22 ^ uVar19 ^ uVar30 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar29;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar24 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x88;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar24);
  uVar5 = uVar5 ^ uVar24 & uVar36;
  uVar24 = uVar24 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar29 = uVar23 ^ uVar29;
  uVar1 = uVar29 << 0x1c ^ uVar29 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar29 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar29);
  uVar12 = uVar9 ^ uVar29 & uVar25;
  uVar29 = uVar29 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar30 = uVar14 ^ uVar30;
  uVar9 = uVar30 << 6 ^ uVar30 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar30 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar31 = uVar17 ^ uVar31;
  uVar31 = uVar31 << 10 ^ uVar31 >> 0x36;
  uVar22 = uVar14 ^ uVar22;
  uVar2 = uVar22 << 0xf ^ uVar22 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar31;
  uVar16 = uVar9 ^ (uVar31 | uVar2);
  uVar31 = uVar31 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar30 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar31 ^ uVar19 ^ uVar29 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar24;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar22 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x80008009;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar22);
  uVar8 = uVar8 ^ uVar22 & uVar34;
  uVar22 = uVar22 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar24 = uVar23 ^ uVar24;
  uVar1 = uVar24 << 0x1c ^ uVar24 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar24 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar24);
  uVar18 = uVar9 ^ uVar24 & uVar20;
  uVar24 = uVar24 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar29 = uVar14 ^ uVar29;
  uVar9 = uVar29 << 6 ^ uVar29 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar29 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar30 = uVar17 ^ uVar30;
  uVar30 = uVar30 << 10 ^ uVar30 >> 0x36;
  uVar31 = uVar14 ^ uVar31;
  uVar2 = uVar31 << 0xf ^ uVar31 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar30;
  uVar16 = uVar9 ^ (uVar30 | uVar2);
  uVar30 = uVar30 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar29 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar30 ^ uVar19 ^ uVar24 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar22;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar31 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000a;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar31);
  uVar5 = uVar5 ^ uVar31 & uVar36;
  uVar31 = uVar31 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar22 = uVar23 ^ uVar22;
  uVar1 = uVar22 << 0x1c ^ uVar22 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar22 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar22);
  uVar12 = uVar9 ^ uVar22 & uVar25;
  uVar22 = uVar22 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar24 = uVar14 ^ uVar24;
  uVar9 = uVar24 << 6 ^ uVar24 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar24 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar29 = uVar17 ^ uVar29;
  uVar29 = uVar29 << 10 ^ uVar29 >> 0x36;
  uVar30 = uVar14 ^ uVar30;
  uVar2 = uVar30 << 0xf ^ uVar30 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar29;
  uVar16 = uVar9 ^ (uVar29 | uVar2);
  uVar29 = uVar29 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar24 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar29 ^ uVar19 ^ uVar22 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar31;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar30 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x8000808b;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar30);
  uVar8 = uVar8 ^ uVar30 & uVar34;
  uVar30 = uVar30 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar31 = uVar23 ^ uVar31;
  uVar1 = uVar31 << 0x1c ^ uVar31 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar31 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar31);
  uVar18 = uVar9 ^ uVar31 & uVar20;
  uVar31 = uVar31 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar22 = uVar14 ^ uVar22;
  uVar9 = uVar22 << 6 ^ uVar22 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar22 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar24 = uVar17 ^ uVar24;
  uVar24 = uVar24 << 10 ^ uVar24 >> 0x36;
  uVar29 = uVar14 ^ uVar29;
  uVar2 = uVar29 << 0xf ^ uVar29 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar24;
  uVar16 = uVar9 ^ (uVar24 | uVar2);
  uVar24 = uVar24 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar22 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar24 ^ uVar19 ^ uVar31 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar30;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar29 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x800000000000008b;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar29);
  uVar5 = uVar5 ^ uVar29 & uVar36;
  uVar29 = uVar29 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar30 = uVar23 ^ uVar30;
  uVar1 = uVar30 << 0x1c ^ uVar30 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar30 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar30);
  uVar12 = uVar9 ^ uVar30 & uVar25;
  uVar30 = uVar30 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar31 = uVar14 ^ uVar31;
  uVar9 = uVar31 << 6 ^ uVar31 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar31 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar22 = uVar17 ^ uVar22;
  uVar22 = uVar22 << 10 ^ uVar22 >> 0x36;
  uVar24 = uVar14 ^ uVar24;
  uVar2 = uVar24 << 0xf ^ uVar24 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar22;
  uVar16 = uVar9 ^ (uVar22 | uVar2);
  uVar22 = uVar22 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar31 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar22 ^ uVar19 ^ uVar30 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar29;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar24 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x8000000000008089;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar24);
  uVar8 = uVar8 ^ uVar24 & uVar34;
  uVar24 = uVar24 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar29 = uVar23 ^ uVar29;
  uVar1 = uVar29 << 0x1c ^ uVar29 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar29 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar29);
  uVar18 = uVar9 ^ uVar29 & uVar20;
  uVar29 = uVar29 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar30 = uVar14 ^ uVar30;
  uVar9 = uVar30 << 6 ^ uVar30 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar30 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar31 = uVar17 ^ uVar31;
  uVar31 = uVar31 << 10 ^ uVar31 >> 0x36;
  uVar22 = uVar14 ^ uVar22;
  uVar2 = uVar22 << 0xf ^ uVar22 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar31;
  uVar16 = uVar9 ^ (uVar31 | uVar2);
  uVar31 = uVar31 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar30 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar31 ^ uVar19 ^ uVar29 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar24;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar22 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000000008003;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar22);
  uVar5 = uVar5 ^ uVar22 & uVar36;
  uVar22 = uVar22 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar24 = uVar23 ^ uVar24;
  uVar1 = uVar24 << 0x1c ^ uVar24 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar24 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar24);
  uVar12 = uVar9 ^ uVar24 & uVar25;
  uVar24 = uVar24 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar29 = uVar14 ^ uVar29;
  uVar9 = uVar29 << 6 ^ uVar29 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar29 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar30 = uVar17 ^ uVar30;
  uVar30 = uVar30 << 10 ^ uVar30 >> 0x36;
  uVar31 = uVar14 ^ uVar31;
  uVar2 = uVar31 << 0xf ^ uVar31 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar30;
  uVar16 = uVar9 ^ (uVar30 | uVar2);
  uVar30 = uVar30 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar29 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar30 ^ uVar19 ^ uVar24 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar22;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar31 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x8000000000008002;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar31);
  uVar8 = uVar8 ^ uVar31 & uVar34;
  uVar31 = uVar31 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar22 = uVar23 ^ uVar22;
  uVar1 = uVar22 << 0x1c ^ uVar22 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar22 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar22);
  uVar18 = uVar9 ^ uVar22 & uVar20;
  uVar22 = uVar22 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar24 = uVar14 ^ uVar24;
  uVar9 = uVar24 << 6 ^ uVar24 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar24 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar29 = uVar17 ^ uVar29;
  uVar29 = uVar29 << 10 ^ uVar29 >> 0x36;
  uVar30 = uVar14 ^ uVar30;
  uVar2 = uVar30 << 0xf ^ uVar30 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar29;
  uVar16 = uVar9 ^ (uVar29 | uVar2);
  uVar29 = uVar29 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar24 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar29 ^ uVar19 ^ uVar22 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar31;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar30 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000000000080;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar30);
  uVar5 = uVar5 ^ uVar30 & uVar36;
  uVar30 = uVar30 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar31 = uVar23 ^ uVar31;
  uVar1 = uVar31 << 0x1c ^ uVar31 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar31 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar31);
  uVar12 = uVar9 ^ uVar31 & uVar25;
  uVar31 = uVar31 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar22 = uVar14 ^ uVar22;
  uVar9 = uVar22 << 6 ^ uVar22 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar22 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar24 = uVar17 ^ uVar24;
  uVar24 = uVar24 << 10 ^ uVar24 >> 0x36;
  uVar29 = uVar14 ^ uVar29;
  uVar2 = uVar29 << 0xf ^ uVar29 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar24;
  uVar16 = uVar9 ^ (uVar24 | uVar2);
  uVar24 = uVar24 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar22 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar24 ^ uVar19 ^ uVar31 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar30;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar29 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x800a;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar29);
  uVar8 = uVar8 ^ uVar29 & uVar34;
  uVar29 = uVar29 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar30 = uVar23 ^ uVar30;
  uVar1 = uVar30 << 0x1c ^ uVar30 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar30 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar30);
  uVar18 = uVar9 ^ uVar30 & uVar20;
  uVar30 = uVar30 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar31 = uVar14 ^ uVar31;
  uVar9 = uVar31 << 6 ^ uVar31 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar31 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar22 = uVar17 ^ uVar22;
  uVar22 = uVar22 << 10 ^ uVar22 >> 0x36;
  uVar24 = uVar14 ^ uVar24;
  uVar2 = uVar24 << 0xf ^ uVar24 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar22;
  uVar16 = uVar9 ^ (uVar22 | uVar2);
  uVar22 = uVar22 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar31 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar22 ^ uVar19 ^ uVar30 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar29;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar24 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x800000008000000a;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar24);
  uVar5 = uVar5 ^ uVar24 & uVar36;
  uVar24 = uVar24 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar29 = uVar23 ^ uVar29;
  uVar1 = uVar29 << 0x1c ^ uVar29 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar29 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar29);
  uVar12 = uVar9 ^ uVar29 & uVar25;
  uVar29 = uVar29 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar30 = uVar14 ^ uVar30;
  uVar9 = uVar30 << 6 ^ uVar30 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar30 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar31 = uVar17 ^ uVar31;
  uVar31 = uVar31 << 10 ^ uVar31 >> 0x36;
  uVar22 = uVar14 ^ uVar22;
  uVar2 = uVar22 << 0xf ^ uVar22 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar31;
  uVar16 = uVar9 ^ (uVar31 | uVar2);
  uVar31 = uVar31 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar30 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar31 ^ uVar19 ^ uVar29 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar24;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar22 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x8000000080008081;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar22);
  uVar8 = uVar8 ^ uVar22 & uVar34;
  uVar22 = uVar22 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar24 = uVar23 ^ uVar24;
  uVar1 = uVar24 << 0x1c ^ uVar24 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar24 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar24);
  uVar18 = uVar9 ^ uVar24 & uVar20;
  uVar24 = uVar24 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar29 = uVar14 ^ uVar29;
  uVar9 = uVar29 << 6 ^ uVar29 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar29 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar30 = uVar17 ^ uVar30;
  uVar30 = uVar30 << 10 ^ uVar30 >> 0x36;
  uVar31 = uVar14 ^ uVar31;
  uVar2 = uVar31 << 0xf ^ uVar31 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar30;
  uVar16 = uVar9 ^ (uVar30 | uVar2);
  uVar30 = uVar30 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar6 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar7 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar6;
  uVar9 = uVar7 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar6 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar29 ^ uVar18 ^ uVar33;
  uVar6 = uVar6 ^ uVar13 & uVar25;
  uVar23 = uVar6 ^ uVar30 ^ uVar19 ^ uVar24 ^ uVar8;
  uVar13 = uVar13 ^ (uVar25 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar20 ^ uVar22;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar27 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar11 ^ uVar12;
  uVar18 = uVar17 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar31 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar26 ^ uVar25;
  uVar36 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar18 = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000000008080;
  uVar32 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar31);
  uVar5 = uVar5 ^ uVar31 & uVar36;
  uVar31 = uVar31 ^ (uVar36 | uVar12);
  uVar36 = uVar36 ^ uVar12 & uVar1;
  uVar22 = uVar23 ^ uVar22;
  uVar1 = uVar22 << 0x1c ^ uVar22 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar22 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar25 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar6 = uVar14 ^ uVar6;
  uVar28 = uVar6 << 0x3d ^ uVar6 >> 3;
  uVar37 = uVar1 ^ (uVar9 | uVar22);
  uVar12 = uVar9 ^ uVar22 & uVar25;
  uVar22 = uVar22 ^ (uVar25 | uVar28 ^ 0xffffffffffffffff);
  uVar25 = uVar25 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar33 = uVar17 ^ uVar33;
  uVar1 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar24 = uVar14 ^ uVar24;
  uVar9 = uVar24 << 6 ^ uVar24 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar7 = uVar11 ^ uVar7;
  uVar6 = uVar7 << 0x12 ^ uVar7 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar24 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
  uVar21 = uVar2 ^ 0xffffffffffffffff ^ (uVar6 | uVar1);
  uVar6 = uVar6 ^ uVar1 & uVar9;
  uVar34 = uVar26 ^ uVar34;
  uVar1 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar11 ^ uVar35;
  uVar9 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar29 = uVar17 ^ uVar29;
  uVar29 = uVar29 << 10 ^ uVar29 >> 0x36;
  uVar30 = uVar14 ^ uVar30;
  uVar2 = uVar30 << 0xf ^ uVar30 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar27 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar7 = uVar1 ^ uVar9 & uVar29;
  uVar16 = uVar9 ^ (uVar29 | uVar2);
  uVar29 = uVar29 ^ (uVar2 ^ 0xffffffffffffffff | uVar27);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar27 & uVar1;
  uVar27 = uVar27 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar8;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar20;
  uVar8 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar3;
  uVar3 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar4;
  uVar13 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar20 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar4 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff) & uVar3;
  uVar9 = uVar4 ^ uVar7 ^ uVar10 ^ uVar37 ^ uVar18;
  uVar15 = uVar8 ^ 0xffffffffffffffff ^ (uVar3 | uVar13);
  uVar14 = uVar15 ^ uVar16 ^ uVar24 ^ uVar12 ^ uVar32;
  uVar3 = uVar3 ^ uVar13 & uVar20;
  uVar23 = uVar3 ^ uVar29 ^ uVar19 ^ uVar22 ^ uVar5;
  uVar13 = uVar13 ^ (uVar20 | uVar1);
  uVar26 = uVar13 ^ uVar2 ^ uVar21 ^ uVar25 ^ uVar31;
  uVar20 = uVar20 ^ uVar1 & uVar8;
  uVar1 = uVar20 ^ uVar27 ^ uVar6 ^ uVar28 ^ uVar36;
  uVar11 = uVar1 ^ uVar14 << 1 ^ uVar14 >> 0x3f;
  uVar17 = uVar9 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
  uVar14 = uVar14 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
  uVar23 = uVar23 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar26 = uVar26 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar18 = uVar11 ^ uVar18;
  uVar12 = uVar17 ^ uVar12;
  uVar1 = uVar12 << 0x2c ^ uVar12 >> 0x14;
  uVar19 = uVar14 ^ uVar19;
  uVar8 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar23 ^ uVar2;
  uVar30 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar20 = uVar26 ^ uVar20;
  uVar34 = uVar20 << 0xe ^ uVar20 >> 0x32;
  uVar12 = uVar18 ^ (uVar1 | uVar8) ^ 0x80000001;
  uVar33 = uVar1 ^ (uVar8 ^ 0xffffffffffffffff | uVar30);
  uVar8 = uVar8 ^ uVar30 & uVar34;
  uVar30 = uVar30 ^ (uVar34 | uVar18);
  uVar34 = uVar34 ^ uVar18 & uVar1;
  uVar31 = uVar23 ^ uVar31;
  uVar1 = uVar31 << 0x1c ^ uVar31 >> 0x24;
  uVar28 = uVar26 ^ uVar28;
  uVar9 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar11 ^ uVar10;
  uVar31 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar17 ^ uVar16;
  uVar20 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar3 = uVar14 ^ uVar3;
  uVar28 = uVar3 << 0x3d ^ uVar3 >> 3;
  uVar35 = uVar1 ^ (uVar9 | uVar31);
  uVar18 = uVar9 ^ uVar31 & uVar20;
  uVar31 = uVar31 ^ (uVar20 | uVar28 ^ 0xffffffffffffffff);
  uVar20 = uVar20 ^ (uVar28 | uVar1);
  uVar28 = uVar28 ^ uVar1 & uVar9;
  uVar32 = uVar17 ^ uVar32;
  uVar1 = uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar22 = uVar14 ^ uVar22;
  uVar9 = uVar22 << 6 ^ uVar22 >> 0x3a;
  uVar21 = uVar23 ^ uVar21;
  uVar19 = uVar21 << 0x19 ^ uVar21 >> 0x27;
  uVar27 = uVar26 ^ uVar27;
  uVar2 = uVar27 << 8 ^ uVar27 >> 0x38;
  uVar4 = uVar11 ^ uVar4;
  uVar3 = uVar4 << 0x12 ^ uVar4 >> 0x2e;
  uVar10 = uVar1 ^ (uVar9 | uVar19);
  uVar22 = uVar9 ^ uVar19 & uVar2;
  uVar19 = uVar19 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
  uVar27 = uVar2 ^ 0xffffffffffffffff ^ (uVar3 | uVar1);
  uVar3 = uVar3 ^ uVar1 & uVar9;
  uVar36 = uVar26 ^ uVar36;
  uVar1 = uVar36 << 0x1b ^ uVar36 >> 0x25;
  uVar37 = uVar11 ^ uVar37;
  uVar9 = uVar37 << 0x24 ^ uVar37 >> 0x1c;
  uVar24 = uVar17 ^ uVar24;
  uVar24 = uVar24 << 10 ^ uVar24 >> 0x36;
  uVar29 = uVar14 ^ uVar29;
  uVar2 = uVar29 << 0xf ^ uVar29 >> 0x31;
  uVar13 = uVar23 ^ uVar13;
  uVar13 = uVar13 << 0x38 ^ uVar13 >> 8;
  uVar4 = uVar1 ^ uVar9 & uVar24;
  uVar16 = uVar9 ^ (uVar24 | uVar2);
  uVar24 = uVar24 ^ (uVar2 ^ 0xffffffffffffffff | uVar13);
  uVar2 = uVar2 ^ 0xffffffffffffffff ^ uVar13 & uVar1;
  uVar13 = uVar13 ^ (uVar1 | uVar9);
  uVar14 = uVar14 ^ uVar5;
  uVar1 = uVar14 << 0x3e ^ uVar14 >> 2;
  uVar23 = uVar23 ^ uVar25;
  uVar5 = uVar23 << 0x37 ^ uVar23 >> 9;
  uVar26 = uVar26 ^ uVar6;
  uVar21 = uVar26 << 0x27 ^ uVar26 >> 0x19;
  uVar11 = uVar11 ^ uVar7;
  uVar11 = uVar11 << 0x29 ^ uVar11 >> 0x17;
  uVar17 = uVar17 ^ uVar15;
  uVar25 = uVar17 << 2 ^ uVar17 >> 0x3e;
  uVar14 = uVar1 ^ (uVar5 ^ 0xffffffffffffffff) & uVar21;
  uVar9 = uVar14 ^ uVar4 ^ uVar10 ^ uVar35 ^ uVar12;
  uVar15 = uVar5 ^ 0xffffffffffffffff ^ (uVar21 | uVar11);
  uVar17 = uVar15 ^ uVar16 ^ uVar22 ^ uVar18 ^ uVar33;
  uVar21 = uVar21 ^ uVar11 & uVar25;
  uVar29 = uVar21 ^ uVar24 ^ uVar19 ^ uVar31 ^ uVar8;
  uVar11 = uVar11 ^ (uVar25 | uVar1);
  uVar32 = uVar11 ^ uVar2 ^ uVar27 ^ uVar20 ^ uVar30;
  uVar25 = uVar25 ^ uVar1 & uVar5;
  uVar1 = uVar25 ^ uVar13 ^ uVar3 ^ uVar28 ^ uVar34;
  uVar36 = uVar1 ^ uVar17 << 1 ^ uVar17 >> 0x3f;
  uVar37 = uVar9 ^ uVar29 << 1 ^ uVar29 >> 0x3f;
  uVar17 = uVar17 ^ uVar32 << 1 ^ uVar32 >> 0x3f;
  uVar29 = uVar29 ^ uVar1 << 1 ^ uVar1 >> 0x3f;
  uVar32 = uVar32 ^ uVar9 << 1 ^ uVar9 >> 0x3f;
  uVar12 = uVar36 ^ uVar12;
  uVar18 = uVar37 ^ uVar18;
  uVar1 = uVar18 << 0x2c ^ uVar18 >> 0x14;
  uVar19 = uVar17 ^ uVar19;
  uVar5 = uVar19 << 0x2b ^ uVar19 >> 0x15;
  uVar2 = uVar29 ^ uVar2;
  uVar9 = uVar2 << 0x15 ^ uVar2 >> 0x2b;
  uVar25 = uVar32 ^ uVar25;
  uVar25 = uVar25 << 0xe ^ uVar25 >> 0x32;
  uVar30 = uVar29 ^ uVar30;
  uVar2 = uVar30 << 0x1c ^ uVar30 >> 0x24;
  uVar28 = uVar32 ^ uVar28;
  uVar6 = uVar28 << 0x14 ^ uVar28 >> 0x2c;
  uVar10 = uVar36 ^ uVar10;
  uVar7 = uVar10 << 3 ^ uVar10 >> 0x3d;
  uVar16 = uVar37 ^ uVar16;
  uVar18 = uVar16 << 0x2d ^ uVar16 >> 0x13;
  uVar21 = uVar17 ^ uVar21;
  uVar19 = uVar21 << 0x3d ^ uVar21 >> 3;
  uVar33 = uVar37 ^ uVar33;
  uVar28 = uVar33 << 1 ^ uVar33 >> 0x3f;
  uVar31 = uVar17 ^ uVar31;
  uVar10 = uVar31 << 6 ^ uVar31 >> 0x3a;
  uVar27 = uVar29 ^ uVar27;
  uVar16 = uVar27 << 0x19 ^ uVar27 >> 0x27;
  uVar13 = uVar32 ^ uVar13;
  uVar21 = uVar13 << 8 ^ uVar13 >> 0x38;
  uVar14 = uVar36 ^ uVar14;
  uVar27 = uVar14 << 0x12 ^ uVar14 >> 0x2e;
  uVar34 = uVar32 ^ uVar34;
  uVar13 = uVar34 << 0x1b ^ uVar34 >> 0x25;
  uVar35 = uVar36 ^ uVar35;
  uVar14 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
  uVar22 = uVar37 ^ uVar22;
  uVar23 = uVar22 << 10 ^ uVar22 >> 0x36;
  uVar24 = uVar17 ^ uVar24;
  uVar26 = uVar24 << 0xf ^ uVar24 >> 0x31;
  uVar11 = uVar29 ^ uVar11;
  uVar11 = uVar11 << 0x38 ^ uVar11 >> 8;
  uVar17 = uVar17 ^ uVar8;
  uVar8 = uVar17 << 0x3e ^ uVar17 >> 2;
  uVar29 = uVar29 ^ uVar20;
  uVar20 = uVar29 << 0x37 ^ uVar29 >> 9;
  uVar32 = uVar32 ^ uVar3;
  uVar3 = uVar32 << 0x27 ^ uVar32 >> 0x19;
  uVar36 = uVar36 ^ uVar4;
  uVar4 = uVar36 << 0x29 ^ uVar36 >> 0x17;
  uVar37 = uVar37 ^ uVar15;
  uVar15 = uVar37 << 2 ^ uVar37 >> 0x3e;
  *in_RDI = uVar12 ^ (uVar1 | uVar5) ^ 0x8000000080008008;
  in_RDI[1] = uVar1 ^ (uVar5 ^ 0xffffffffffffffff | uVar9);
  in_RDI[2] = uVar5 ^ uVar9 & uVar25;
  in_RDI[3] = uVar9 ^ (uVar25 | uVar12);
  in_RDI[4] = uVar25 ^ uVar12 & uVar1;
  in_RDI[5] = uVar2 ^ (uVar6 | uVar7);
  in_RDI[6] = uVar6 ^ uVar7 & uVar18;
  in_RDI[7] = uVar7 ^ (uVar18 | uVar19 ^ 0xffffffffffffffff);
  in_RDI[8] = uVar18 ^ (uVar19 | uVar2);
  in_RDI[9] = uVar19 ^ uVar2 & uVar6;
  in_RDI[10] = uVar28 ^ (uVar10 | uVar16);
  in_RDI[0xb] = uVar10 ^ uVar16 & uVar21;
  in_RDI[0xc] = uVar16 ^ (uVar21 ^ 0xffffffffffffffff) & uVar27;
  in_RDI[0xd] = uVar21 ^ 0xffffffffffffffff ^ (uVar27 | uVar28);
  in_RDI[0xe] = uVar27 ^ uVar28 & uVar10;
  in_RDI[0xf] = uVar13 ^ uVar14 & uVar23;
  in_RDI[0x10] = uVar14 ^ (uVar23 | uVar26);
  in_RDI[0x11] = uVar23 ^ (uVar26 ^ 0xffffffffffffffff | uVar11);
  in_RDI[0x12] = uVar26 ^ 0xffffffffffffffff ^ uVar11 & uVar13;
  in_RDI[0x13] = uVar11 ^ (uVar13 | uVar14);
  in_RDI[0x14] = uVar8 ^ (uVar20 ^ 0xffffffffffffffff) & uVar3;
  in_RDI[0x15] = uVar20 ^ 0xffffffffffffffff ^ (uVar3 | uVar4);
  in_RDI[0x16] = uVar3 ^ uVar4 & uVar15;
  in_RDI[0x17] = uVar4 ^ (uVar15 | uVar8);
  in_RDI[0x18] = uVar15 ^ uVar8 & uVar20;
  return;
}

Assistant:

static void KeccakPermutationOnWordsAfterXoring1344bits(UINT64 *state, const UINT64 *input)
{
    declareABCDE
#if (Unrolling != 24)
    unsigned int i;
#endif

    copyFromStateAndXor1344bits(A, state, input)
    rounds
#if defined(UseMMX)
    _mm_empty();
#endif
}